

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

void __thiscall MppMemService::dump(MppMemService *this,char *caller)

{
  MppMemLog *pMVar1;
  MppMemLog *log;
  RK_S32 tmp_cnt;
  RK_S32 start;
  MppMemNode *node;
  RK_S32 i;
  char *caller_local;
  MppMemService *this_local;
  
  _tmp_cnt = this->nodes;
  _mpp_log_l(4,"mpp_mem","mpp_mem enter status dumping from %s:\n",(char *)0x0,caller);
  _mpp_log_l(4,"mpp_mem","mpp_mem node count %d:\n",(char *)0x0,(ulong)(uint)this->nodes_cnt);
  if (this->nodes_cnt != 0) {
    for (node._4_4_ = 0; node._4_4_ < this->nodes_max; node._4_4_ = node._4_4_ + 1) {
      if (-1 < _tmp_cnt->index) {
        _mpp_log_l(4,"mpp_mem","mpp_memory index %d caller %-32s size %-8u ptr %p\n",(char *)0x0,
                   (ulong)(uint)_tmp_cnt->index,_tmp_cnt->caller,_tmp_cnt->size,_tmp_cnt->ptr);
      }
      _tmp_cnt = _tmp_cnt + 1;
    }
  }
  _tmp_cnt = this->frees;
  _mpp_log_l(4,"mpp_mem","mpp_mem free count %d:\n",(char *)0x0,(ulong)(uint)this->frees_cnt);
  if (this->frees_cnt != 0) {
    for (node._4_4_ = 0; node._4_4_ < this->frees_max; node._4_4_ = node._4_4_ + 1) {
      if (-1 < _tmp_cnt->index) {
        _mpp_log_l(4,"mpp_mem","mpp_freed  index %d caller %-32s size %-8u ptr %p\n",(char *)0x0,
                   (ulong)(uint)_tmp_cnt->index,_tmp_cnt->caller,_tmp_cnt->size,_tmp_cnt->ptr);
      }
      _tmp_cnt = _tmp_cnt + 1;
    }
  }
  log._4_4_ = this->log_idx - this->log_cnt;
  log._0_4_ = this->log_cnt;
  if (log._4_4_ < 0) {
    log._4_4_ = this->log_max + log._4_4_;
  }
  _mpp_log_l(4,"mpp_mem","mpp_mem enter log dumping:\n",(char *)0x0);
  for (; (RK_S32)log != 0; log._0_4_ = (RK_S32)log + -1) {
    pMVar1 = this->logs + log._4_4_;
    _mpp_log_l(4,"mpp_mem","idx %-8d op: %-7s from %-32s ptr %10p %10p size %7d %7d\n",(char *)0x0,
               (ulong)pMVar1->index,ops2str[pMVar1->ops],pMVar1->caller,pMVar1->ptr,pMVar1->ret,
               pMVar1->size_0,pMVar1->size_1);
    log._4_4_ = log._4_4_ + 1;
    if (this->log_max <= log._4_4_) {
      log._4_4_ = 0;
    }
  }
  return;
}

Assistant:

void MppMemService::dump(const char *caller)
{
    RK_S32 i;
    MppMemNode *node = nodes;

    mpp_log("mpp_mem enter status dumping from %s:\n", caller);

    mpp_log("mpp_mem node count %d:\n", nodes_cnt);
    if (nodes_cnt) {
        for (i = 0; i < nodes_max; i++, node++) {
            if (node->index < 0)
                continue;

            mpp_log("mpp_memory index %d caller %-32s size %-8u ptr %p\n",
                    node->index, node->caller, node->size, node->ptr);
        }
    }

    node = frees;
    mpp_log("mpp_mem free count %d:\n", frees_cnt);
    if (frees_cnt) {
        for (i = 0; i < frees_max; i++, node++) {
            if (node->index < 0)
                continue;

            mpp_log("mpp_freed  index %d caller %-32s size %-8u ptr %p\n",
                    node->index, node->caller, node->size, node->ptr);
        }
    }

    RK_S32 start = log_idx - log_cnt;
    RK_S32 tmp_cnt = log_cnt;

    if (start < 0)
        start += log_max;

    mpp_log("mpp_mem enter log dumping:\n");

    while (tmp_cnt) {
        MppMemLog *log = &logs[start];

        mpp_log("idx %-8d op: %-7s from %-32s ptr %10p %10p size %7d %7d\n",
                log->index, ops2str[log->ops], log->caller,
                log->ptr, log->ret, log->size_0, log->size_1);

        start++;
        if (start >= log_max)
            start = 0;

        tmp_cnt--;
    }
}